

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

CRef __thiscall
Minisat::ClauseAllocator::alloc<Minisat::Clause>(ClauseAllocator *this,Clause *ps,bool learnt)

{
  Ref RVar1;
  undefined7 in_register_00000011;
  uint uVar2;
  
  uVar2 = 4;
  if ((int)CONCAT71(in_register_00000011,learnt) == 0) {
    uVar2 = (byte)(this->super_RegionAllocator<unsigned_int>).field_0x14 | 2;
  }
  RVar1 = RegionAllocator<unsigned_int>::alloc
                    (&this->super_RegionAllocator<unsigned_int>,uVar2 + (SUB84(ps->header,4) >> 2));
  Clause::Clause<Minisat::Clause>
            ((Clause *)((this->super_RegionAllocator<unsigned_int>).memory + RVar1),ps,
             (bool)(this->super_RegionAllocator<unsigned_int>).field_0x14,learnt);
  return RVar1;
}

Assistant:

CRef alloc(const Lits &ps, bool learnt = false)
    {
        assert(sizeof(Lit) == sizeof(uint32_t));
        assert(sizeof(float) == sizeof(uint32_t));
        int extras = learnt ? 2 : (int)extra_clause_field;

        CRef cid = RegionAllocator<uint32_t>::alloc(clauseWord32Size(ps.size(), extras));
        new (lea(cid)) Clause(ps, extra_clause_field, learnt);

        return cid;
    }